

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  ulong uVar2;
  int iVar3;
  Array path;
  Array path_00;
  ulong uVar4;
  int maxDepth;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  TVar5;
  RGBFilm *pRVar6;
  uintptr_t iptr;
  Float FVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [56];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [56];
  undefined1 in_register_000012c4 [12];
  Bounds2f BVar20;
  SampledSpectrum SVar21;
  int local_16c;
  optional<pbrt::Point2<float>_> pRasterNew;
  undefined1 local_138 [16];
  optional<pbrt::CameraRayDifferential> crd;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  SamplerHandle local_88;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_80;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_78;
  uintptr_t local_70;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_68;
  SamplerHandle local_60;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_58;
  SamplerHandle local_50;
  CameraSample cameraSample;
  undefined1 auVar14 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [64];
  
  auVar11._0_8_ = in_ZMM1._12_8_;
  maxDepth = 0;
  MLTSampler::StartStream(sampler,0);
  if (depth == 0) {
    local_16c = 2;
    fVar16 = 1.0;
  }
  else {
    FVar7 = MLTSampler::Get1D(sampler);
    fVar16 = (float)(depth + 2);
    maxDepth = depth + 1;
    if ((int)(FVar7 * fVar16) <= depth + 1) {
      maxDepth = (int)(FVar7 * fVar16);
    }
    local_16c = (depth + 2) - maxDepth;
  }
  if (*(char *)(Options + 0xd) == '\x01') {
    uVar2 = *(ulong *)(((this->camera).
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits & 0xffffffffffff) + 0x340);
    pRVar6 = (RGBFilm *)(uVar2 & 0xffffffffffff);
    if (uVar2 < 0x2000000000000) {
      RGBFilm::SampleWavelengths((SampledWavelengths *)&crd,pRVar6,0.5);
    }
    else {
      GBufferFilm::SampleWavelengths((SampledWavelengths *)&crd,(GBufferFilm *)pRVar6,0.5);
    }
    *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values = crd.optionalValue.__align;
    *(undefined8 *)((lambda->lambda).values + 2) = crd.optionalValue._8_8_;
    *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
    *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  }
  else {
    uVar2 = *(ulong *)(((this->camera).
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits & 0xffffffffffff) + 0x340);
    FVar7 = MLTSampler::Get1D(sampler);
    pRVar6 = (RGBFilm *)(uVar2 & 0xffffffffffff);
    if (uVar2 < 0x2000000000000) {
      RGBFilm::SampleWavelengths((SampledWavelengths *)&crd,pRVar6,FVar7);
    }
    else {
      GBufferFilm::SampleWavelengths((SampledWavelengths *)&crd,(GBufferFilm *)pRVar6,FVar7);
    }
    *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values = crd.optionalValue.__align;
    *(undefined8 *)((lambda->lambda).values + 2) = crd.optionalValue._8_8_;
    *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
    *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  }
  local_138._8_8_ = crd.optionalValue._8_8_;
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_16c);
  BVar20 = FilmBase::SampleBounds
                     ((FilmBase *)
                      (*(ulong *)(((this->camera).
                                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                   .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff));
  local_138._0_4_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  local_138._4_4_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  auVar12._0_8_ = MLTSampler::Get2D(sampler);
  auVar12._8_56_ = extraout_var;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar17,auVar12._0_16_);
  local_98 = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_94 = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_90 = (float)auVar11._0_8_;
  fStack_8c = (float)((ulong)auVar11._0_8_ >> 0x20);
  auVar9._0_4_ = auVar12._0_4_ * local_98;
  auVar9._4_4_ = auVar12._4_4_ * fStack_94;
  auVar9._8_4_ = extraout_var._0_4_ * fStack_90;
  auVar9._12_4_ = extraout_var._4_4_ * fStack_8c;
  auVar17 = vfmadd231ps_fma(auVar9,auVar17,local_138);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar17);
  pRaster->super_Tuple2<pbrt::Point2,_float> = TVar1;
  local_138._0_8_ = 0;
  cameraSample.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  cameraSample.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  cameraSample.time = 0.0;
  cameraSample.weight = 1.0;
  cameraSample.pFilm.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar17);
  FVar7 = MLTSampler::Get1D(sampler);
  cameraSample.time = FVar7;
  auVar13._0_8_ = MLTSampler::Get2D(sampler);
  auVar13._8_56_ = extraout_var_00;
  cameraSample.pLens.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar13._0_16_);
  CameraHandle::GenerateRayDifferential(&crd,&this->camera,&cameraSample,lambda);
  if (crd.set == true) {
    if (((float)crd.optionalValue._96_4_ == 0.0) && (!NAN((float)crd.optionalValue._96_4_))) {
      uVar2 = 0;
      while (uVar4 = uVar2, uVar4 != 3) {
        fVar8 = *(float *)((long)&crd.optionalValue + uVar4 * 4 + 100);
        if ((fVar8 != 0.0) || (uVar2 = uVar4 + 1, NAN(fVar8))) break;
      }
      if (2 < uVar4) goto LAB_0042521b;
    }
    auVar10._0_4_ = (float)sampler->mutationsPerPixel;
    auVar10._4_12_ = in_register_000012c4;
    if (auVar10._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar10._0_4_);
    }
    else {
      auVar17 = vsqrtss_avx(auVar10,auVar10);
      fVar8 = auVar17._0_4_;
    }
    if (crd.set != true) {
LAB_00425249:
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
    }
    auVar19 = (undefined1  [56])0x0;
    auVar17 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar8)),ZEXT416(0x3e000000));
    RayDifferential::ScaleDifferentials((RayDifferential *)&crd,auVar17._0_4_);
    if (crd.set == false) goto LAB_00425249;
    TVar5.bits = (ulong)sampler | 0x7000000000000;
    local_58.bits =
         (this->camera).
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_50.
    super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )TVar5.bits;
    iVar3 = GenerateCameraSubpath
                      (&this->super_Integrator,(RayDifferential *)&crd,lambda,&local_50,
                       scratchBuffer,local_16c,(CameraHandle *)&local_58,path,this->regularize);
    if (iVar3 == local_16c) {
      MLTSampler::StartStream(sampler,1);
      path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)maxDepth);
      local_68.bits =
           (this->camera).
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_70 = (this->lightSampler).
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 .bits;
      local_60.
      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )TVar5.bits;
      iVar3 = GenerateLightSubpath
                        (&this->super_Integrator,lambda,&local_60,(CameraHandle *)&local_68,
                         scratchBuffer,maxDepth,(path->field_2).ei.super_Interaction.time,
                         (LightSamplerHandle)&local_70,path_00,this->regularize);
      auVar11._0_8_ = 0;
      auVar15 = ZEXT856(0);
      if (iVar3 == maxDepth) {
        MLTSampler::StartStream(sampler,2);
        pRasterNew.set = false;
        local_78.bits =
             (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
        local_80.bits =
             (this->camera).
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_88.
        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )TVar5.bits;
        SVar21 = ConnectBDPT(&this->super_Integrator,lambda,path_00,path,maxDepth,local_16c,
                             (LightSamplerHandle *)&local_78,(CameraHandle *)&local_80,&local_88,
                             &pRasterNew,(Float *)0x0);
        auVar18._0_8_ = SVar21.values.values._8_8_;
        auVar18._8_56_ = auVar19;
        auVar14._0_8_ = SVar21.values.values._0_8_;
        auVar14._8_56_ = auVar15;
        auVar17 = vmovlhps_avx(auVar14._0_16_,auVar18._0_16_);
        auVar11._0_8_ = CONCAT44(fVar16 * auVar17._4_4_,fVar16 * auVar17._0_4_);
        auVar11._8_4_ = fVar16 * auVar17._8_4_;
        auVar11._12_4_ = fVar16 * auVar17._12_4_;
        if (pRasterNew.set == true) {
          pRaster->super_Tuple2<pbrt::Point2,_float> =
               (Tuple2<pbrt::Point2,_float>)pRasterNew.optionalValue;
        }
        auVar17 = vshufpd_avx(auVar11,auVar11,1);
        local_138._0_8_ = auVar17._0_8_;
      }
      goto LAB_0042521f;
    }
  }
LAB_0042521b:
  auVar11._0_8_ = 0;
LAB_0042521f:
  SVar21.values.values[2] = (float)local_138._0_4_;
  SVar21.values.values[3] = (float)local_138._4_4_;
  SVar21.values.values[0] = (float)(int)auVar11._0_8_;
  SVar21.values.values[1] = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  return (SampledSpectrum)SVar21.values.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew.has_value())
        *pRaster = *pRasterNew;
    return L;
}